

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeGroupTo<google::protobuf::internal::ArrayOutput>
               (MessageLite *msg,void *table_ptr,ArrayOutput *output)

{
  FieldMetadata *field_table_00;
  MessageLite *in_RSI;
  long in_RDI;
  int num_fields;
  int cached_size;
  uint8 *base;
  FieldMetadata *field_table;
  SerializationTable *table;
  ArrayOutput *in_stack_00000058;
  MessageLite *in_stack_00000060;
  
  if (in_RSI == (MessageLite *)0x0) {
    SerializeMessageNoTable(in_stack_00000060,in_stack_00000058);
  }
  else {
    field_table_00 = (FieldMetadata *)(in_RSI->_internal_metadata_).ptr_;
    SerializeMessageDispatch
              (in_RSI,field_table_00,(int)((ulong)in_RDI >> 0x20),(int32)in_RDI,
               (ArrayOutput *)
               CONCAT44(*(undefined4 *)(in_RDI + (ulong)field_table_00->offset),
                        *(int *)&in_RSI->_vptr_MessageLite + -1));
  }
  return;
}

Assistant:

void SerializeGroupTo(const MessageLite* msg, const void* table_ptr,
                      O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8* base = reinterpret_cast<const uint8*>(msg);
  int cached_size = *reinterpret_cast<const int32*>(base + field_table->offset);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}